

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O0

bech32_error bech32_encode(bech32_bstring *bstring,char *hrp,uchar *dp,size_t dplen)

{
  char *pcVar1;
  uchar *__last;
  ulong uVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  unsigned_long __n;
  long lVar3;
  exception *anon_var_0;
  string local_a8 [8];
  string b;
  undefined1 local_80 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> dpVec;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string hrpStr;
  size_t dplen_local;
  uchar *dp_local;
  char *hrp_local;
  bech32_bstring *bstring_local;
  
  if (bstring == (bech32_bstring *)0x0) {
    bstring_local._4_4_ = E_BECH32_NULL_ARGUMENT;
  }
  else if (hrp == (char *)0x0) {
    bstring_local._4_4_ = E_BECH32_NULL_ARGUMENT;
  }
  else if (dp == (uchar *)0x0) {
    bstring_local._4_4_ = E_BECH32_NULL_ARGUMENT;
  }
  else {
    hrpStr.field_2._8_8_ = dplen;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,hrp,&local_51);
    std::allocator<char>::~allocator(&local_51);
    __last = dp + hrpStr.field_2._8_8_;
    std::allocator<unsigned_char>::allocator
              ((allocator<unsigned_char> *)(b.field_2._M_local_buf + 0xf));
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_80,dp,__last,
               (allocator<unsigned_char> *)(b.field_2._M_local_buf + 0xf));
    std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)(b.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string(local_a8);
    bech32::encode((string *)&anon_var_0,(string *)local_50,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
    std::__cxx11::string::operator=(local_a8,(string *)&anon_var_0);
    std::__cxx11::string::~string((string *)&anon_var_0);
    uVar2 = std::__cxx11::string::size();
    if (bstring->length < uVar2) {
      bstring_local._4_4_ = E_BECH32_LENGTH_TOO_SHORT;
    }
    else {
      __first._M_current = (char *)std::__cxx11::string::begin();
      __n = std::__cxx11::string::size();
      std::copy_n<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,char*>
                (__first,__n,bstring->string);
      pcVar1 = bstring->string;
      lVar3 = std::__cxx11::string::size();
      pcVar1[lVar3] = '\0';
      bstring_local._4_4_ = E_BECH32_SUCCESS;
    }
    std::__cxx11::string::~string(local_a8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
    std::__cxx11::string::~string((string *)local_50);
  }
  return bstring_local._4_4_;
}

Assistant:

bech32_error bech32_encode(
        bech32_bstring *bstring,
        const char *hrp,
        const unsigned char *dp, size_t dplen) {

    if(bstring == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(hrp == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(dp == nullptr)
        return E_BECH32_NULL_ARGUMENT;

    std::string hrpStr(hrp);
    std::vector<unsigned char> dpVec(dp, dp + dplen);

    std::string b;
    try {
        b = bech32::encode(hrpStr, dpVec);
    }
    catch (std::exception &) {
        // todo: convert exception message
        return E_BECH32_UNKNOWN_ERROR;
    }
    if(b.size() > bstring->length)
        return E_BECH32_LENGTH_TOO_SHORT;

    std::copy_n(b.begin(), b.size(), bstring->string);
    bstring->string[b.size()] = '\0';

    return E_BECH32_SUCCESS;
}